

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
  *a_param;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
  *ptVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_00000107;
  CodeLocation *in_stack_00000108;
  string *in_stack_00000110;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffc98;
  CodeLocation *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb0;
  value_type *in_stack_fffffffffffffcb8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  pointer in_stack_fffffffffffffcd0;
  CodeLocation *in_stack_fffffffffffffce8;
  tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
  *in_stack_fffffffffffffd08;
  int line_00;
  char *in_stack_fffffffffffffd10;
  Message *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  void *in_stack_fffffffffffffd78;
  CodeLocation *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  ostream *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  undefined6 in_stack_fffffffffffffdb0;
  ParamNameGeneratorFunc *tear_down_tc;
  _Head_base<4UL,_aom_bit_depth,_false> local_1f8;
  QuantType QStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
  *in_stack_fffffffffffffe48;
  string local_1b0 [32];
  string local_190 [32];
  _Base_ptr local_170;
  undefined1 local_168;
  GTestLog local_160;
  GTestLog local_15c;
  TestParamInfo<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  local_158;
  string local_130 [3];
  size_t local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>
                   *)in_stack_fffffffffffffc98);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>
                         *)in_stack_fffffffffffffc98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffca0,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
                  *)in_stack_fffffffffffffca0,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
                  *)in_stack_fffffffffffffc98);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffc98);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffc98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffca0,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc98);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xd744ce);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xd744f9);
      ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
      ::begin((ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
               *)in_stack_fffffffffffffca8);
      while( true ) {
        ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
        ::end((ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
               *)in_stack_fffffffffffffca8);
        bVar1 = ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                ::operator!=((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                              *)in_stack_fffffffffffffca0,
                             (ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                              *)in_stack_fffffffffffffc98);
        ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
        ::~ParamIterator((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                          *)0xd74554);
        iVar3 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffcd0);
        tear_down_tc = local_70;
        a_param = ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                  ::operator*((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                               *)0xd745fd);
        TestParamInfo<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
        ::TestParamInfo(&local_158,a_param,local_c8);
        (*tear_down_tc)(local_130,&local_158);
        condition = IsValidParamName(in_stack_fffffffffffffca8);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                             in_stack_fffffffffffffd10,line_00);
          poVar7 = GTestLog::GetStream(&local_15c);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffda0 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffd98 = std::operator<<(in_stack_fffffffffffffda0,(string *)local_130)
          ;
          in_stack_fffffffffffffd90 =
               std::operator<<(in_stack_fffffffffffffd98,"\' is invalid, in ");
          in_stack_fffffffffffffd88 = std::operator<<(in_stack_fffffffffffffd90,local_78);
          in_stack_fffffffffffffd80 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffd88," line ");
          in_stack_fffffffffffffd78 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd80,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd78,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffca0);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                             in_stack_fffffffffffffd10,line_00);
          poVar7 = GTestLog::GetStream(&local_160);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffca0);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        local_170 = (_Base_ptr)pVar10.first._M_node;
        in_stack_fffffffffffffd27 = pVar10.second;
        local_168 = in_stack_fffffffffffffd27;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd749e6);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xd74a03);
          in_stack_fffffffffffffd18 =
               Message::operator<<((Message *)in_stack_fffffffffffffca0,
                                   &in_stack_fffffffffffffc98->file);
          Message::operator<<((Message *)in_stack_fffffffffffffca0,
                              (char (*) [2])in_stack_fffffffffffffc98);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffca0,&in_stack_fffffffffffffc98->file);
        in_stack_fffffffffffffd10 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffca8);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffd08 =
             ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
             ::operator*((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                          *)0xd74a98);
        PrintToString<std::tuple<void(*)(short_const*,long,short_const*,short_const*,short*,short*,short_const*,unsigned_short*,short_const*,short_const*),void(*)(short_const*,long,short_const*,short_const*,short*,short*,short_const*,unsigned_short*,short_const*,short_const*),unsigned_char,(anonymous_namespace)::QuantType,aom_bit_depth>>
                  (in_stack_fffffffffffffe48);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd74ad2);
        CodeLocation::CodeLocation(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffc98 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::LowPrecisionQuantizeTest>::GetSetUpCaseOrSuite
                       (filename,iVar3);
        in_stack_fffffffffffffca0 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::LowPrecisionQuantizeTest>::
             GetTearDownCaseOrSuite(filename,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd74b43);
        in_stack_fffffffffffffcd0 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
                           *)0xd74b4f);
        ptVar9 = ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                 ::operator*((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                              *)0xd74b61);
        local_1f8._M_head_impl =
             (ptVar9->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
             ).
             super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
             .super__Tuple_impl<2UL,_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
             .super__Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
             super__Tuple_impl<4UL,_aom_bit_depth>.super__Head_base<4UL,_aom_bit_depth,_false>.
             _M_head_impl;
        QStack_1f4 = (ptVar9->
                     super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                     ).
                     super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                     .
                     super__Tuple_impl<2UL,_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                     .super__Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
                     super__Head_base<3UL,_(anonymous_namespace)::QuantType,_false>._M_head_impl;
        uStack_1f0 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                       ).
                       super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                       .
                       super__Tuple_impl<2UL,_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                       .super__Head_base<2UL,_unsigned_char,_false>;
        uStack_1ec = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                       ).
                       super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                       .field_0xc;
        local_1e8 = *(undefined4 *)
                     &(ptVar9->
                      super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                      ).
                      super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                      .
                      super__Head_base<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_false>
                      ._M_head_impl;
        uStack_1e4 = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                              ).
                              super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                              .
                              super__Head_base<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_false>
                              ._M_head_impl + 4);
        uStack_1e0 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                       ).
                       super__Head_base<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_false>
                       ._M_head_impl;
        uStack_1dc = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
                              ).
                              super__Head_base<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_false>
                              ._M_head_impl + 4);
        iVar3 = (*in_stack_fffffffffffffcd0->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffcd0,&local_1f8);
        in_stack_fffffffffffffca8 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffcc8 = in_stack_fffffffffffffca8;
        in_stack_fffffffffffffce8 = in_stack_fffffffffffffc98;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
                   (char *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                   in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffdb0))
                   ,(TearDownTestSuiteFunc)tear_down_tc,(TestFactoryBase *)a_param);
        CodeLocation::~CodeLocation((CodeLocation *)0xd74bf2);
        std::__cxx11::string::~string(local_1b0);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0xd74c26);
        ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
        ::operator++((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                      *)in_stack_fffffffffffffca0);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
      ::~ParamIterator((ParamIterator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                        *)0xd7456c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xd74ceb);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
      ::~ParamGenerator((ParamGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                         *)0xd74d05);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>
                   *)0xd74d4d);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowPrecisionQuantizeTest>::TestInfo>_>_>
             *)in_stack_fffffffffffffcb0);
    InsertSyntheticTestCase(in_stack_00000110,in_stack_00000108,in_stack_00000107);
    CodeLocation::~CodeLocation((CodeLocation *)0xd74de7);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }